

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O2

void __thiscall Clasp::Cli::JsonOutput::printSummary(JsonOutput *this,Summary *run,bool final)

{
  FacadePtr pCVar1;
  byte bVar2;
  bool bVar3;
  Model *m;
  uint64 v;
  SumVec *pSVar4;
  uint uVar5;
  char *pcVar6;
  char *v_00;
  Summary *this_00;
  uint local_38;
  uint uStack_34;
  double dStack_30;
  
  popUntil(this,(uint)!final * 2 + 1);
  bVar2 = (run->result).flags & 3;
  if (bVar2 == 2) {
    pcVar6 = "UNSATISFIABLE";
  }
  else if (bVar2 == 1) {
    bVar3 = ClaspFacade::Summary::optimum(run);
    pcVar6 = "SATISFIABLE";
    if (bVar3) {
      pcVar6 = "OPTIMUM FOUND";
    }
  }
  else {
    pcVar6 = "UNKNOWN";
  }
  printKeyValue(this,"Result",pcVar6);
  if ((this->super_Output).verbose_ != 0) {
    if (((run->result).flags & 8) != 0) {
      pcVar6 = "INTERRUPTED";
      if ((run->result).signal == '\x0e') {
        pcVar6 = "TIME LIMIT";
      }
      printKeyValue(this,pcVar6,1);
    }
    pushObject(this,"Models",type_object,false);
    printKeyValue(this,"Number",run->numEnum);
    pcVar6 = "no";
    if (((run->result).flags & 4) == 0) {
      pcVar6 = "yes";
    }
    printKeyValue(this,"More",pcVar6);
    if (((run->result).flags & 3) == 1) {
      pcVar6 = ClaspFacade::Summary::consequences(run);
      if (pcVar6 != (char *)0x0) {
        pcVar6 = ClaspFacade::Summary::consequences(run);
        v_00 = "unknown";
        if (((run->result).flags & 4) != 0) {
          v_00 = "yes";
        }
        printKeyValue(this,pcVar6,v_00);
        pCVar1 = run->facade;
        this_00 = run;
        m = ClaspFacade::Summary::model(run);
        _local_38 = Output::numCons((Output *)this_00,&(pCVar1->ctx).output,m);
        printCons(this,(UPair *)&stack0xffffffffffffffc8);
      }
      bVar3 = ClaspFacade::Summary::optimize(run);
      if (bVar3) {
        bVar3 = ClaspFacade::Summary::optimum(run);
        pcVar6 = "unknown";
        if (bVar3) {
          pcVar6 = "yes";
        }
        printKeyValue(this,"Optimum",pcVar6);
        v = ClaspFacade::Summary::optimal(run);
        printKeyValue(this,"Optimal",v);
        pSVar4 = ClaspFacade::Summary::costs(run);
        printCosts(this,pSVar4,"Costs");
      }
    }
    popObject(this);
    bVar3 = ClaspFacade::Summary::hasLower(run);
    if ((bVar3) && (bVar3 = ClaspFacade::Summary::optimum(run), !bVar3)) {
      pushObject(this,"Bounds",type_object,false);
      ClaspFacade::Summary::lower((Summary *)&stack0xffffffffffffffc8);
      printCosts(this,(SumVec *)&stack0xffffffffffffffc8,"Lower");
      bk_lib::pod_vector<long,_std::allocator<long>_>::ebo::~ebo((ebo *)&stack0xffffffffffffffc8);
      pSVar4 = ClaspFacade::Summary::costs(run);
      if (pSVar4 == (SumVec *)0x0) {
        local_38 = 0;
        uStack_34 = 0;
        dStack_30 = 0.0;
      }
      else {
        pSVar4 = ClaspFacade::Summary::costs(run);
        bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
                  ((pod_vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffc8,pSVar4);
      }
      printCosts(this,(SumVec *)&stack0xffffffffffffffc8,"Upper");
      bk_lib::pod_vector<long,_std::allocator<long>_>::ebo::~ebo((ebo *)&stack0xffffffffffffffc8);
      popObject(this);
    }
    if (final) {
      printKeyValue(this,"Calls",(ulong)(run->step + 1));
    }
    pushObject(this,"Time",type_object,false);
    printKeyValue(this,"Total",run->totalTime);
    printKeyValue(this,"Solve",run->solveTime);
    printKeyValue(this,"Model",run->satTime);
    printKeyValue(this,"Unsat",run->unsatTime);
    printKeyValue(this,"CPU",run->cpuTime);
    popObject(this);
    uVar5 = (uint)(run->facade->ctx).share_ & 0x3ff;
    if (1 < uVar5) {
      printKeyValue(this,"Threads",(ulong)uVar5);
      printKeyValue(this,"Winner",(ulong)((uint)(run->facade->ctx).share_ >> 10 & 0x3ff));
    }
  }
  return;
}

Assistant:

void JsonOutput::printSummary(const ClaspFacade::Summary& run, bool final) {
	popUntil(final ? 1u : 3u);
	const char* res = "UNKNOWN";
	if      (run.unsat()) { res = "UNSATISFIABLE"; }
	else if (run.sat())   { res = !run.optimum() ? "SATISFIABLE" : "OPTIMUM FOUND"; }
	printKeyValue("Result", res);
	if (verbosity()) {
		if (run.result.interrupted()){ printKeyValue(run.result.signal != SIGALRM ? "INTERRUPTED" : "TIME LIMIT", uint32(1));  }
		pushObject("Models");
		printKeyValue("Number", run.numEnum);
		printKeyValue("More"  , run.complete() ? "no" : "yes");
		if (run.sat()) {
			if (run.consequences()){
				printKeyValue(run.consequences(), run.complete() ? "yes":"unknown");
				printCons(numCons(run.ctx().output, *run.model()));
			}
			if (run.optimize())    {
				printKeyValue("Optimum", run.optimum()?"yes":"unknown");
				printKeyValue("Optimal", run.optimal());
				printCosts(*run.costs());
			}
		}
		popObject();
		if (run.hasLower() && !run.optimum()) {
			pushObject("Bounds");
			printCosts(run.lower(), "Lower");
			printCosts(run.costs() ? *run.costs() : SumVec(), "Upper");
			popObject();
		}
		if (final) { printKeyValue("Calls", run.step + 1); }
		pushObject("Time");
		printKeyValue("Total", run.totalTime);
		printKeyValue("Solve", run.solveTime);
		printKeyValue("Model", run.satTime);
		printKeyValue("Unsat", run.unsatTime);
		printKeyValue("CPU"  , run.cpuTime);
		popObject(); // Time
		if (run.ctx().concurrency() > 1) {
			printKeyValue("Threads", run.ctx().concurrency());
			printKeyValue("Winner",  run.ctx().winner());
		}
	}
}